

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::LocalFileSystem::Seek(LocalFileSystem *this,FileHandle *handle,idx_t location)

{
  int iVar1;
  IOException *this_00;
  allocator local_39;
  string local_38;
  
  iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x24])();
  if ((char)iVar1 != '\0') {
    SetFilePointer(this,handle,location);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Cannot seek in files of this type",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LocalFileSystem::Seek(FileHandle &handle, idx_t location) {
	if (!CanSeek()) {
		throw IOException("Cannot seek in files of this type");
	}
	SetFilePointer(handle, location);
}